

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O3

void std::allocator_traits<std::allocator<vkt::(anonymous_namespace)::Subpass>>::
     construct<vkt::(anonymous_namespace)::Subpass,vkt::(anonymous_namespace)::Subpass>
               (allocator_type *__a,Subpass *__p,Subpass *__args)

{
  pointer pAVar1;
  pointer puVar2;
  
  *(undefined8 *)__a = *(undefined8 *)__p;
  pAVar1 = (__p->m_inputAttachments).
           super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 8) =
       (__p->m_inputAttachments).
       super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(__a + 0x10) = pAVar1;
  *(pointer *)(__a + 0x18) =
       (__p->m_inputAttachments).
       super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__p->m_inputAttachments).
  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->m_inputAttachments).
  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->m_inputAttachments).
  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pAVar1 = (__p->m_colorAttachments).
           super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 0x20) =
       (__p->m_colorAttachments).
       super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(__a + 0x28) = pAVar1;
  *(pointer *)(__a + 0x30) =
       (__p->m_colorAttachments).
       super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__p->m_colorAttachments).
  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->m_colorAttachments).
  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->m_colorAttachments).
  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pAVar1 = (__p->m_resolveAttachments).
           super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 0x38) =
       (__p->m_resolveAttachments).
       super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(__a + 0x40) = pAVar1;
  *(pointer *)(__a + 0x48) =
       (__p->m_resolveAttachments).
       super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__p->m_resolveAttachments).
  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->m_resolveAttachments).
  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->m_resolveAttachments).
  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(AttachmentReference *)(__a + 0x50) = __p->m_depthStencilAttachment;
  puVar2 = (__p->m_preserveAttachments).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 0x58) =
       (__p->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(__a + 0x60) = puVar2;
  *(pointer *)(__a + 0x68) =
       (__p->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (__p->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Subpass						(VkPipelineBindPoint				pipelineBindPoint,
																	 VkSubpassDescriptionFlags			flags,
																	 const vector<AttachmentReference>&	inputAttachments,
																	 const vector<AttachmentReference>&	colorAttachments,
																	 const vector<AttachmentReference>&	resolveAttachments,
																	 AttachmentReference				depthStencilAttachment,
																	 const vector<deUint32>&			preserveAttachments)
		: m_pipelineBindPoint		(pipelineBindPoint)
		, m_flags					(flags)
		, m_inputAttachments		(inputAttachments)
		, m_colorAttachments		(colorAttachments)
		, m_resolveAttachments		(resolveAttachments)
		, m_depthStencilAttachment	(depthStencilAttachment)
		, m_preserveAttachments		(preserveAttachments)
	{
	}